

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall DiceRoller::~DiceRoller(DiceRoller *this)

{
  _Vector_base<int,_std::allocator<int>_> *this_00;
  
  operator_delete(this->diceRolled,4);
  this_00 = &this->history->super__Vector_base<int,_std::allocator<int>_>;
  if (this_00 != (_Vector_base<int,_std::allocator<int>_> *)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

DiceRoller::~DiceRoller() {
    delete diceRolled;
    delete history;
}